

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preserve_unknown_enum_test.cc
# Opt level: O2

void __thiscall
google::protobuf::PreserveUnknownEnumTest_DynamicProto2HidesUnknownValues_Test::TestBody
          (PreserveUnknownEnumTest_DynamicProto2HidesUnknownValues_Test *this)

{
  bool bVar1;
  Descriptor *type;
  Message *this_00;
  MessageLite *this_01;
  pointer *__ptr;
  char *pcVar2;
  string_view data;
  string_view data_00;
  AssertHelper local_158;
  AssertHelper local_150;
  AssertionResult gtest_ar_1;
  string serialized;
  MyMessage message2;
  DynamicMessageFactory factory;
  MyMessagePlusExtra orig_message;
  
  proto3_preserve_unknown_enum_unittest::MyMessagePlusExtra::MyMessagePlusExtra(&orig_message);
  anon_unknown_15::FillMessage(&orig_message);
  serialized._M_dataplus._M_p = (pointer)&serialized.field_2;
  serialized._M_string_length = 0;
  serialized.field_2._M_local_buf[0] = '\0';
  MessageLite::SerializeToString((MessageLite *)&orig_message,&serialized);
  DynamicMessageFactory::DynamicMessageFactory(&factory);
  type = proto2_preserve_unknown_enum_unittest::MyMessage::GetDescriptor();
  this_00 = DynamicMessageFactory::GetPrototype(&factory,type);
  this_01 = &Message::New(this_00)->super_MessageLite;
  gtest_ar_1.success_ = true;
  data._M_str = serialized._M_dataplus._M_p;
  data._M_len = serialized._M_string_length;
  bVar1 = MessageLite::ParseFromString(this_01,data);
  local_158.data_._0_1_ = bVar1;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&message2,"true","message->ParseFromString(serialized)",
             &gtest_ar_1.success_,(bool *)&local_158);
  if ((char)message2.super_Message.super_MessageLite._vptr_MessageLite == '\0') {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (message2.super_Message.super_MessageLite._internal_metadata_.ptr_ == 0) {
      pcVar2 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar2 = *(char **)message2.super_Message.super_MessageLite._internal_metadata_.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/preserve_unknown_enum_test.cc"
               ,0x8c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_158,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    if ((long *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&message2.super_Message.super_MessageLite._internal_metadata_);
  proto2_preserve_unknown_enum_unittest::MyMessage::MyMessage(&message2);
  Message::CopyFrom(&message2.super_Message,(Message *)this_01);
  Message::DiscardUnknownFields(&message2.super_Message);
  local_150.data_._0_4_ = 0;
  local_158.data_ =
       (AssertHelperData *)proto2_preserve_unknown_enum_unittest::MyMessage::ByteSizeLong(&message2)
  ;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&gtest_ar_1,"0","message2.ByteSizeLong()",(int *)&local_150,
             (unsigned_long *)&local_158);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_158);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar2 = *(char **)gtest_ar_1.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/preserve_unknown_enum_test.cc"
               ,0x91,pcVar2);
    testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    if (local_158.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_158.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_1.message_);
  serialized._M_string_length = 0;
  *serialized._M_dataplus._M_p = '\0';
  MessageLite::SerializeToString(this_01,&serialized);
  local_158.data_._0_1_ = 1;
  data_00._M_str = serialized._M_dataplus._M_p;
  data_00._M_len = serialized._M_string_length;
  bVar1 = MessageLite::ParseFromString((MessageLite *)&orig_message,data_00);
  local_150.data_._0_4_ = CONCAT31(local_150.data_._1_3_,bVar1);
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&gtest_ar_1,"true","orig_message.ParseFromString(serialized)",
             (bool *)&local_158,(bool *)&local_150);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_158);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar2 = *(char **)gtest_ar_1.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/preserve_unknown_enum_test.cc"
               ,0x96,pcVar2);
    testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    if (local_158.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_158.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_1.message_);
  anon_unknown_15::CheckMessage(&orig_message);
  proto2_preserve_unknown_enum_unittest::MyMessage::~MyMessage(&message2);
  (*this_01->_vptr_MessageLite[1])(this_01);
  DynamicMessageFactory::~DynamicMessageFactory(&factory);
  std::__cxx11::string::~string((string *)&serialized);
  proto3_preserve_unknown_enum_unittest::MyMessagePlusExtra::~MyMessagePlusExtra(&orig_message);
  return;
}

Assistant:

TEST(PreserveUnknownEnumTest, DynamicProto2HidesUnknownValues) {
  proto3_preserve_unknown_enum_unittest::MyMessagePlusExtra orig_message;
  FillMessage(&orig_message);

  std::string serialized;
  orig_message.SerializeToString(&serialized);

  DynamicMessageFactory factory;
  std::unique_ptr<Message> message(
      factory
          .GetPrototype(
              proto2_preserve_unknown_enum_unittest::MyMessage::descriptor())
          ->New());
  EXPECT_EQ(true, message->ParseFromString(serialized));
  // The intermediate message has everything in its "unknown fields".
  proto2_preserve_unknown_enum_unittest::MyMessage message2;
  message2.CopyFrom(*message);
  message2.DiscardUnknownFields();
  EXPECT_EQ(0, message2.ByteSizeLong());

  // But when we pass it to the correct structure, all values are there.
  serialized.clear();
  message->SerializeToString(&serialized);
  EXPECT_EQ(true, orig_message.ParseFromString(serialized));
  CheckMessage(orig_message);
}